

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_input.hpp
# Opt level: O2

void __thiscall
tao::pegtl::
memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>::
memory_input<char_const(&)[1]>
          (memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>
           *this,string *in_string,char (*in_source) [1])

{
  char *in_begin;
  
  in_begin = (in_string->_M_dataplus)._M_p;
  internal::
  memory_input_base<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>
  ::memory_input_base<char_const(&)[1]>
            ((memory_input_base<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>
              *)this,in_begin,in_begin + in_string->_M_string_length,in_source);
  return;
}

Assistant:

memory_input( const std::string& in_string, T&& in_source ) noexcept( std::is_nothrow_constructible< Source, T&& >::value )
            : memory_input( in_string.data(), in_string.size(), std::forward< T >( in_source ) )
         {
         }